

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * anon_unknown.dwarf_10d873::CreatePhi
                    (VmModule *module,SynBase *source,VmInstruction *valueA,VmInstruction *valueB)

{
  VmValue *in_RAX;
  VmInstruction *pVVar1;
  VmType type;
  
  if (valueA == (VmInstruction *)0x0) {
    __assert_fail("valueA",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x33f,
                  "VmValue *(anonymous namespace)::CreatePhi(VmModule *, SynBase *, VmInstruction *, VmInstruction *)"
                 );
  }
  if (valueB != (VmInstruction *)0x0) {
    if (((valueA->super_VmValue).type.type == (valueB->super_VmValue).type.type) &&
       ((valueA->super_VmValue).type.size == (valueB->super_VmValue).type.size)) {
      type.structType = (TypeBase *)0x4d;
      type._0_8_ = (valueA->super_VmValue).type.structType;
      pVVar1 = CreateInstruction((anon_unknown_dwarf_10d873 *)module,(VmModule *)source,
                                 *(SynBase **)&(valueA->super_VmValue).type,type,
                                 (VmInstructionType)valueA,&valueA->parent->super_VmValue,
                                 &valueB->super_VmValue,&valueB->parent->super_VmValue,
                                 (VmValue *)0x0,in_RAX);
      return &pVVar1->super_VmValue;
    }
    __assert_fail("valueA->type == valueB->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x341,
                  "VmValue *(anonymous namespace)::CreatePhi(VmModule *, SynBase *, VmInstruction *, VmInstruction *)"
                 );
  }
  __assert_fail("valueB",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x340,
                "VmValue *(anonymous namespace)::CreatePhi(VmModule *, SynBase *, VmInstruction *, VmInstruction *)"
               );
}

Assistant:

VmValue* CreatePhi(VmModule *module, SynBase *source, VmInstruction *valueA, VmInstruction *valueB)
	{
		assert(valueA);
		assert(valueB);
		assert(valueA->type == valueB->type);

		return CreateInstruction(module, source, valueA->type, VM_INST_PHI, valueA, valueA->parent, valueB, valueB->parent);
	}